

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_util.cpp
# Opt level: O0

bool spvtools::opt::blockmergeutil::anon_unknown_0::IsContinue(IRContext *context,uint32_t id)

{
  uint32_t id_00;
  bool bVar1;
  DefUseManager *this;
  anon_class_1_0_00000001 local_39;
  function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> local_38;
  uint32_t local_14;
  IRContext *pIStack_10;
  uint32_t id_local;
  IRContext *context_local;
  
  local_14 = id;
  pIStack_10 = context;
  this = IRContext::get_def_use_mgr(context);
  id_00 = local_14;
  std::function<bool(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::blockmergeutil::(anonymous_namespace)::IsContinue(spvtools::opt::IRContext*,unsigned_int)::__0,void>
            ((function<bool(spvtools::opt::Instruction*,unsigned_int)> *)&local_38,&local_39);
  bVar1 = analysis::DefUseManager::WhileEachUse(this,id_00,&local_38);
  std::function<bool_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_38);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool IsContinue(IRContext* context, uint32_t id) {
  return !context->get_def_use_mgr()->WhileEachUse(
      id, [](Instruction* user, uint32_t index) {
        spv::Op op = user->opcode();
        if (op == spv::Op::OpLoopMerge && index == 1u) {
          return false;
        }
        return true;
      });
}